

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O2

int Abc_NtkMaxFlowVerifyCut_rec(Abc_Obj_t *pObj,int fForward)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (fForward == 0) {
      iVar1 = 0;
      if ((uVar2 != 2) && (iVar1 = 0, uVar2 != 5)) {
        lVar4 = 0;
        iVar1 = 0;
        do {
          if ((pObj->vFanins).nSize <= lVar4) goto LAB_006e2948;
          iVar3 = Abc_NtkMaxFlowVerifyCut_rec
                            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]],0
                            );
          lVar4 = lVar4 + 1;
        } while (iVar3 != 0);
      }
    }
    else {
      if (uVar2 - 5 < 0xfffffffe) {
        lVar4 = 0;
        do {
          if ((pObj->vFanouts).nSize <= lVar4) goto LAB_006e2948;
          iVar1 = Abc_NtkMaxFlowVerifyCut_rec
                            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],
                             fForward);
          lVar4 = lVar4 + 1;
        } while (iVar1 != 0);
      }
      iVar1 = 0;
    }
  }
  else {
LAB_006e2948:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkMaxFlowVerifyCut_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 1;
    Abc_NodeSetTravIdCurrent(pObj);
    // visit the node
    if ( fForward )
    {
        if ( Abc_ObjIsCo(pObj) )
            return 0;
        // explore the fanouts
        Abc_ObjForEachFanout( pObj, pNext, i )
            if ( !Abc_NtkMaxFlowVerifyCut_rec(pNext, fForward) )
                return 0;
    }
    else
    {
        if ( Abc_ObjIsCi(pObj) )
            return 0;
        // explore the fanins
        Abc_ObjForEachFanin( pObj, pNext, i )
            if ( !Abc_NtkMaxFlowVerifyCut_rec(pNext, fForward) )
                return 0;
    }
    return 1;
}